

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::CheckSumConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,CheckSumConvertor *this,int value)

{
  FieldConvertError *this_00;
  undefined4 in_register_00000014;
  allocator local_51;
  char local_50 [3];
  undefined1 local_4d;
  char result [3];
  allocator<char> local_39;
  string local_38;
  int local_14;
  string *psStack_10;
  int value_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if ((local_14 < 0x100) && (-1 < local_14)) {
    integer_to_string_padded<int>(local_50,3,local_14,'0');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_50,3,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    return __return_storage_ptr__;
  }
  local_4d = 1;
  this_00 = (FieldConvertError *)
            __cxa_allocate_exception(0x50,this,CONCAT44(in_register_00000014,value));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FieldConvertError::FieldConvertError(this_00,&local_38);
  local_4d = 0;
  __cxa_throw(this_00,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value > 255 || value < 0) {
      throw FieldConvertError();
    }
    char result[3];
    integer_to_string_padded(result, sizeof(result), value);
    return std::string(result, sizeof(result));
  }